

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_interactor.cpp
# Opt level: O1

void inc_int_value(Am_Object *obj,Am_Slot_Key slot,int inc,Am_Object *param_4)

{
  int iVar1;
  Am_Value *this;
  
  this = Am_Object::Get(obj,slot,0);
  iVar1 = Am_Value::operator_cast_to_int(this);
  Am_Object::Set(obj,slot,inc + iVar1,0);
  return;
}

Assistant:

void
inc_int_value(Am_Object &obj, Am_Slot_Key slot, int inc,
              Am_Object & /*command_obj*/)
{
#endif
  int cur_val = obj.Get(slot);
  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                       "++ Animation command "
                           << command_obj << " incrementing slot " << slot
                           << " of " << obj << " by " << inc << " to be (int)"
                           << cur_val + inc);
  obj.Set(slot, cur_val + inc);
}